

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O2

const_reference __thiscall
OpenMesh::BaseKernel::property<OpenMesh::Attributes::StatusInfo>
          (BaseKernel *this,VPropHandleT<OpenMesh::Attributes::StatusInfo> _ph,VertexHandle _vh)

{
  PropertyT<OpenMesh::Attributes::StatusInfo> *this_00;
  const_reference pvVar1;
  
  this_00 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                      (&this->vprops_,
                       _ph.super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                       idx_);
  pvVar1 = PropertyT<OpenMesh::Attributes::StatusInfo>::operator[]
                     (this_00,(int)_vh.super_BaseHandle.idx_);
  return pvVar1;
}

Assistant:

typename VPropHandleT<T>::const_reference
  property(VPropHandleT<T> _ph, VertexHandle _vh) const {
    return vprops_.property(_ph)[_vh.idx()];
  }